

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O1

wchar_t initialize_summary(player *p,equippable_summary **s)

{
  player_body *ppVar1;
  size_t len;
  loc grid;
  loc grid_00;
  _Bool _Var2;
  wchar_t wVar3;
  equippable_summary *peVar4;
  ui_entry_iterator *i;
  ui_entry **ppuVar5;
  wchar_t **ppwVar6;
  wchar_t *pwVar7;
  ui_entry *puVar8;
  equippable_expr *peVar9;
  equippable_arranger *peVar10;
  object *poVar11;
  store *psVar12;
  equippable *peVar13;
  int *piVar14;
  long lVar15;
  wchar_t wVar16;
  code *pcVar17;
  equippable_expr_class *peVar18;
  prop_category *ppVar19;
  player *ppVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  void *pvVar25;
  wchar_t count;
  player *p_1;
  wchar_t a;
  wchar_t v;
  cached_player_data *pcache;
  obj_visitor_data visitor;
  char *test_categories [2];
  add_obj_to_summary_closure add_obj_data;
  wchar_t local_d4;
  player *local_d0;
  int local_c4;
  prop_category *local_c0;
  void *local_b8;
  cached_object_data *local_b0;
  ulong local_a8;
  int local_9c;
  equippable_summary *local_98;
  cached_player_data *local_90;
  obj_visitor_data local_88;
  ui_entry_combiner_funcs local_68;
  player *local_48;
  equippable_summary *local_40;
  undefined4 local_38;
  
  local_d0 = p;
  if (the_summary != (equippable_summary *)0x0) goto LAB_001e6a19;
  peVar4 = (equippable_summary *)mem_alloc(0x200);
  lVar24 = 0;
  the_summary = peVar4;
  peVar4->items = (equippable *)0x0;
  peVar4->nitems = L'\0';
  peVar4->nalloc = L'\0';
  peVar4->stores = EQUIPPABLE_NO_STORE;
  peVar4->ifirst = L'\0';
  peVar4->p_and_eq_auxvals = (int *)0x0;
  peVar4->dlg_trans_msg = (char *)0x0;
  peVar4->sorted_indices = (int *)0x0;
  peVar4->p_and_eq_vals = (int *)0x0;
  peVar4->indinc = L'\x01';
  peVar4->iview = L'\0';
  peVar4->npage = L'\0';
  peVar4->nshortnm = L'\0';
  peVar4->nproplab = L'\x02';
  peVar4->term_ncol = L'\xffffffff';
  peVar4->term_nrow = L'\xffffffff';
  peVar4->irow_combined_equip = L'\x03';
  peVar4->icol_name = L'\x04';
  peVar4->nprop = L'\0';
  local_68.init_func = (_func_void_int_int_ui_entry_combiner_state_ptr *)0x23e9e1;
  do {
    local_68.accum_func =
         (_func_void_int_int_ui_entry_combiner_state_ptr *)
         (&PTR_anon_var_dwarf_194c6d_00285ae0)[lVar24];
    i = initialize_ui_entry_iterator(check_for_two_categories,&local_68,(char *)local_68.accum_func)
    ;
    wVar3 = count_ui_entry_iterator(i);
    peVar4 = the_summary;
    the_summary->nprop = the_summary->nprop + wVar3;
    peVar4->propcats[lVar24].n = wVar3;
    wVar16 = L'\0';
    if (lVar24 != 0) {
      wVar16 = peVar4->propcats[lVar24 + -1].n + peVar4->propcats[lVar24 + -1].off;
    }
    peVar4->propcats[lVar24].off = wVar16;
    len = (long)wVar3 * 8;
    ppuVar5 = (ui_entry **)mem_alloc(len);
    the_summary->propcats[lVar24].entries = ppuVar5;
    ppwVar6 = (wchar_t **)mem_alloc(len);
    peVar4 = the_summary;
    the_summary->propcats[lVar24].labels = ppwVar6;
    pwVar7 = (wchar_t *)mem_alloc(((long)peVar4->nproplab + 1) * (long)wVar3 * 4);
    the_summary->propcats[lVar24].label_buffer = pwVar7;
    if (L'\0' < wVar3) {
      uVar23 = 0;
      do {
        puVar8 = advance_ui_entry_iterator(i);
        peVar4 = the_summary;
        the_summary->propcats[lVar24].entries[uVar23] = puVar8;
        peVar4->propcats[lVar24].labels[uVar23] =
             peVar4->propcats[lVar24].label_buffer +
             (long)(int)uVar23 * ((long)peVar4->nproplab + 1);
        get_ui_entry_label(puVar8,the_summary->nproplab + L'\x01',true,
                           the_summary->propcats[lVar24].labels[uVar23]);
        uVar23 = uVar23 + 1;
      } while ((uint)wVar3 != uVar23);
    }
    release_ui_entry_iterator(i);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 5);
  (the_summary->easy_filt).nalloc = L'\x05';
  peVar9 = (equippable_expr *)mem_alloc(0x78);
  peVar4 = the_summary;
  (the_summary->easy_filt).v = peVar9;
  switch(peVar4->stores) {
  case EQUIPPABLE_NO_STORE:
    (peVar4->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar4->easy_filt).nv = L'\x01';
    pcVar17 = sel_exclude_src;
    goto LAB_001e6901;
  case EQUIPPABLE_ONLY_STORE:
    (peVar4->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar4->easy_filt).nv = L'\x01';
    pcVar17 = sel_only_src;
LAB_001e6901:
    (peVar9->s).func = pcVar17;
    peVar4 = the_summary;
    (((the_summary->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
    ((peVar4->easy_filt).v)->c = EQUIP_EXPR_SELECTOR;
    break;
  case EQUIPPABLE_YES_STORE:
    (peVar4->easy_filt).simple = EQUIP_EXPR_TERMINATOR;
    (peVar4->easy_filt).nv = L'\0';
    break;
  case EQUIPPABLE_ONLY_CARRIED:
    (peVar4->easy_filt).simple = EQUIP_EXPR_AND;
    (peVar4->easy_filt).nv = L'\x03';
    (peVar9->s).func = sel_exclude_src;
    peVar4 = the_summary;
    (((the_summary->easy_filt).v)->s).ex.src = EQUIP_SOURCE_STORE;
    peVar9 = (peVar4->easy_filt).v;
    peVar9->c = EQUIP_EXPR_SELECTOR;
    peVar9[1].s.func = sel_exclude_src;
    peVar9[1].s.ex.src = EQUIP_SOURCE_HOME;
    peVar9 = (peVar4->easy_filt).v;
    peVar9[1].c = EQUIP_EXPR_SELECTOR;
    peVar9[2].s.func = sel_exclude_src;
    peVar9[2].s.ex.src = EQUIP_SOURCE_FLOOR;
    (peVar4->easy_filt).v[2].c = EQUIP_EXPR_SELECTOR;
  }
  peVar4 = the_summary;
  wVar3 = (the_summary->easy_filt).nv;
  wVar16 = (the_summary->easy_filt).nalloc;
  if (wVar3 < wVar16) {
    peVar18 = &(the_summary->easy_filt).v[wVar3].c;
    lVar24 = (long)wVar16 - (long)wVar3;
    do {
      *peVar18 = EQUIP_EXPR_TERMINATOR;
      peVar18 = peVar18 + 6;
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  (peVar4->config_filt).v = (equippable_expr *)0x0;
  (peVar4->config_filt).simple = EQUIP_EXPR_TERMINATOR;
  (peVar4->config_filt).nv = L'\0';
  (peVar4->config_filt).nalloc = L'\0';
  (peVar4->config_mod_filt).v = (equippable_expr *)0x0;
  (peVar4->config_mod_filt).simple = EQUIP_EXPR_TERMINATOR;
  (peVar4->config_mod_filt).nv = L'\0';
  (peVar4->config_mod_filt).nalloc = L'\0';
  peVar4->config_filt_is_on = false;
  (peVar4->default_sort).nalloc = L'\x05';
  peVar10 = (equippable_arranger *)mem_alloc(0x50);
  peVar4 = the_summary;
  (the_summary->default_sort).v = peVar10;
  peVar10->func = cmp_by_slot;
  peVar10->propind = L'\0';
  peVar10[1].func = cmp_by_location;
  peVar10[1].propind = L'\0';
  peVar10[2].func = cmp_by_quality;
  peVar10[2].propind = L'\0';
  peVar10[3].func = cmp_by_short_name;
  peVar10[3].propind = L'\0';
  peVar10[4].func = (equippable_cmpfunc)0x0;
  peVar10[4].propind = L'\0';
  (peVar4->default_sort).nv = L'\x04';
  peVar4->config_sort_is_on = false;
  (peVar4->config_sort).v = (equippable_arranger *)0x0;
  (peVar4->config_sort).nv = L'\0';
  (peVar4->config_sort).nalloc = L'\0';
LAB_001e6a19:
  ppVar20 = local_d0;
  wVar3 = reconfigure_for_term_if_necessary(false,local_d0,the_summary);
  wVar16 = L'\x01';
  if (wVar3 == L'\0') {
    local_88.usefunc_closure = &local_d4;
    local_d4 = L'\0';
    local_88.usefunc = count_objects;
    local_88.selfunc = select_any;
    local_88.selfunc_closure = (void *)0x0;
    apply_visitor_to_equipped(ppVar20,&local_88);
    local_88.selfunc = select_nonequipped_wearable;
    poVar11 = ppVar20->gear;
    if (poVar11 != (object *)0x0) {
      ppVar1 = &local_d0->body;
      local_88.selfunc_closure = ppVar20;
      do {
        _Var2 = tval_is_wearable(poVar11);
        if ((_Var2) && (_Var2 = object_is_equipped(*ppVar1,poVar11), !_Var2)) {
          local_d4 = local_d4 + L'\x01';
        }
        poVar11 = poVar11->next;
      } while (poVar11 != (object *)0x0);
    }
    ppVar20 = local_d0;
    if (cave != (chunk_conflict *)0x0) {
      local_88.selfunc = select_seen_wearable;
      local_88.selfunc_closure = local_d0;
      grid.x = (local_d0->grid).x;
      grid.y = (local_d0->grid).y;
      for (poVar11 = square_object(cave,grid); poVar11 != (object *)0x0; poVar11 = poVar11->next) {
        _Var2 = select_seen_wearable(poVar11,ppVar20);
        if (_Var2) {
          local_d4 = local_d4 + L'\x01';
        }
      }
    }
    local_88.selfunc = select_wearable;
    local_88.selfunc_closure = (void *)0x0;
    psVar12 = store_home(ppVar20);
    if (psVar12 != (store *)0x0) {
      psVar12 = store_home(ppVar20);
      for (poVar11 = psVar12->stock; poVar11 != (object *)0x0; poVar11 = poVar11->next) {
        _Var2 = tval_is_wearable(poVar11);
        if (_Var2) {
          local_d4 = local_d4 + L'\x01';
        }
      }
    }
    if (the_summary->nalloc < local_d4) {
      mem_free(the_summary->sorted_indices);
      cleanup_summary_items(the_summary);
      mem_free(the_summary->items);
      peVar13 = (equippable *)mem_zalloc((long)local_d4 * 0x38);
      the_summary->items = peVar13;
      piVar14 = (int *)mem_alloc((long)local_d4 * 4 + 4);
      peVar4 = the_summary;
      the_summary->sorted_indices = piVar14;
      peVar4->nalloc = local_d4;
    }
    ppVar20 = local_d0;
    local_40 = the_summary;
    the_summary->nitems = L'\0';
    local_88.usefunc = add_obj_to_summary;
    local_88.usefunc_closure = &local_48;
    local_48 = local_d0;
    local_38 = 0;
    local_88.selfunc = select_any;
    local_88.selfunc_closure = (void *)0x0;
    apply_visitor_to_equipped(local_d0,&local_88);
    local_38 = 1;
    local_88.selfunc = select_nonequipped_wearable;
    local_88.selfunc_closure = ppVar20;
    poVar11 = ppVar20->gear;
    if (poVar11 != (object *)0x0) {
      ppVar1 = &local_d0->body;
      do {
        _Var2 = tval_is_wearable(poVar11);
        if ((_Var2) && (_Var2 = object_is_equipped(*ppVar1,poVar11), !_Var2)) {
          add_obj_to_summary(poVar11,&local_48);
        }
        poVar11 = poVar11->next;
      } while (poVar11 != (object *)0x0);
    }
    ppVar20 = local_d0;
    if (cave != (chunk_conflict *)0x0) {
      local_38 = 2;
      local_88.selfunc = select_seen_wearable;
      local_88.selfunc_closure = local_d0;
      grid_00.x = (local_d0->grid).x;
      grid_00.y = (local_d0->grid).y;
      poVar11 = square_object(cave,grid_00);
      if (poVar11 != (object *)0x0) {
        do {
          _Var2 = select_seen_wearable(poVar11,ppVar20);
          if (_Var2) {
            add_obj_to_summary(poVar11,&local_48);
          }
          poVar11 = poVar11->next;
        } while (poVar11 != (object *)0x0);
      }
    }
    local_38 = 3;
    local_88.selfunc = select_wearable;
    local_88.selfunc_closure = (void *)0x0;
    psVar12 = store_home(ppVar20);
    if (psVar12 != (store *)0x0) {
      psVar12 = store_home(ppVar20);
      poVar11 = psVar12->stock;
      if (poVar11 != (object *)0x0) {
        do {
          _Var2 = tval_is_wearable(poVar11);
          if (_Var2) {
            add_obj_to_summary(poVar11,&local_48);
          }
          poVar11 = poVar11->next;
        } while (poVar11 != (object *)0x0);
      }
    }
    peVar4 = the_summary;
    if (the_summary->p_and_eq_vals == (int *)0x0) {
      piVar14 = (int *)mem_alloc((long)the_summary->nprop << 2);
      peVar4->p_and_eq_vals = piVar14;
    }
    if (peVar4->p_and_eq_auxvals == (int *)0x0) {
      piVar14 = (int *)mem_alloc((long)peVar4->nprop << 2);
      peVar4->p_and_eq_auxvals = piVar14;
    }
    local_90 = (cached_player_data *)0x0;
    local_b8 = mem_alloc((long)peVar4->nprop << 4);
    local_98 = peVar4;
    local_c0 = peVar4->propcats;
    uVar23 = 0;
    do {
      local_a8 = uVar23;
      if (L'\0' < local_c0[uVar23].n) {
        ppVar19 = local_c0 + uVar23;
        lVar24 = 0;
        pvVar25 = local_b8;
        do {
          puVar8 = ppVar19->entries[lVar24];
          wVar3 = get_ui_entry_renderer_index(puVar8);
          wVar3 = ui_entry_renderer_query_combiner(wVar3);
          if (wVar3 < L'\x01') {
            __assert_fail("combind > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                          ,0x8dd,
                          "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                         );
          }
          ui_entry_combiner_get_funcs(wVar3,&local_68);
          compute_ui_entry_values_for_player(puVar8,local_d0,&local_90,(int *)&local_b0,&local_c4);
          (*local_68.init_func)
                    ((int)local_b0,local_c4,
                     (ui_entry_combiner_state *)((long)ppVar19->off * 0x10 + (long)pvVar25));
          lVar24 = lVar24 + 1;
          pvVar25 = (void *)((long)pvVar25 + 0x10);
        } while (lVar24 < ppVar19->n);
      }
      uVar23 = local_a8 + 1;
    } while (uVar23 != 5);
    release_cached_player_data(local_90);
    peVar4 = local_98;
    if ((local_d0->body).count != 0) {
      uVar23 = 0;
      ppVar20 = local_d0;
      do {
        poVar11 = slot_object(ppVar20,(wchar_t)uVar23);
        local_b0 = (cached_object_data *)0x0;
        if (poVar11 != (object *)0x0) {
          lVar24 = 0;
          local_a8 = uVar23;
          do {
            if (L'\0' < local_c0[lVar24].n) {
              ppVar19 = local_c0 + lVar24;
              lVar21 = 0;
              pvVar25 = local_b8;
              do {
                wVar3 = get_ui_entry_renderer_index(ppVar19->entries[lVar21]);
                wVar3 = ui_entry_renderer_query_combiner(wVar3);
                if (wVar3 < L'\x01') {
                  __assert_fail("combind > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                                ,0x8fa,
                                "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                               );
                }
                ui_entry_combiner_get_funcs(wVar3,&local_68);
                compute_ui_entry_values_for_object
                          (ppVar19->entries[lVar21],poVar11,local_d0,&local_b0,&local_c4,&local_9c);
                (*local_68.accum_func)
                          (local_c4,local_9c,
                           (ui_entry_combiner_state *)((long)ppVar19->off * 0x10 + (long)pvVar25));
                lVar21 = lVar21 + 1;
                pvVar25 = (void *)((long)pvVar25 + 0x10);
              } while (lVar21 < ppVar19->n);
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != 5);
          release_cached_object_data(local_b0);
          ppVar20 = local_d0;
          peVar4 = local_98;
          uVar23 = local_a8;
        }
        uVar22 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar22;
      } while (uVar22 < (ppVar20->body).count);
    }
    lVar24 = 0;
    do {
      if (L'\0' < local_c0[lVar24].n) {
        ppVar19 = local_c0 + lVar24;
        lVar21 = 0;
        pvVar25 = local_b8;
        do {
          wVar3 = get_ui_entry_renderer_index(ppVar19->entries[lVar21]);
          wVar3 = ui_entry_renderer_query_combiner(wVar3);
          if (wVar3 < L'\x01') {
            __assert_fail("combind > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                          ,0x911,
                          "void compute_player_and_equipment_values(struct player *, struct equippable_summary *)"
                         );
          }
          ui_entry_combiner_get_funcs(wVar3,&local_68);
          (*local_68.finish_func)
                    ((ui_entry_combiner_state *)((long)ppVar19->off * 0x10 + (long)pvVar25));
          lVar15 = ppVar19->off + lVar21;
          peVar4->p_and_eq_vals[lVar15] = *(int *)((long)local_b8 + lVar15 * 0x10 + 8);
          lVar15 = ppVar19->off + lVar21;
          peVar4->p_and_eq_auxvals[lVar15] = *(int *)((long)local_b8 + lVar15 * 0x10 + 0xc);
          lVar21 = lVar21 + 1;
          pvVar25 = (void *)((long)pvVar25 + 0x10);
        } while (lVar21 < ppVar19->n);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != 5);
    mem_free(local_b8);
    filter_items(the_summary);
    sort_dat_0 = the_summary->items;
    sort_dat_1 = (&the_summary->default_sort)[the_summary->config_sort_is_on].v;
    sort(the_summary->sorted_indices,(long)the_summary->nfilt,4,cmp_for_sort_items);
    peVar4 = the_summary;
    peVar4->isel0 = L'\xffffffff';
    peVar4->isel1 = L'\xffffffff';
    peVar4->work_sel = L'\xffffffff';
    wVar16 = L'\0';
  }
  return wVar16;
}

Assistant:

static int initialize_summary(struct player *p,
	struct equippable_summary **s)
{
	struct obj_visitor_data visitor;
	struct add_obj_to_summary_closure add_obj_data;
	int count, i;

	if (*s == NULL) {
		const char *categories[] = {
			"resistances",
			"abilities",
			"hindrances",
			"modifiers",
			"stat_modifiers"
		};
		const char *test_categories[2];

		*s = mem_alloc(sizeof(**s));
		(*s)->items = NULL;
		(*s)->sorted_indices = NULL;
		(*s)->p_and_eq_vals = NULL;
		(*s)->p_and_eq_auxvals = NULL;
		(*s)->dlg_trans_msg = NULL;
		(*s)->nitems = 0;
		(*s)->nalloc = 0;
		(*s)->stores = EQUIPPABLE_NO_STORE;
		(*s)->ifirst = 0;
		(*s)->indinc = 1;
		(*s)->iview = 0;
		(*s)->npage = 0;
		(*s)->nshortnm = 0;
		(*s)->term_ncol = -1;
		(*s)->term_nrow = -1;

		/* These are currently hardwired layout choices. */
		(*s)->nproplab = 2;
		(*s)->irow_combined_equip = (*s)->nproplab + 1;
		/*
		 * Leave room for a character (item character), a space,
		 * a character (item location code), and a space.
		 */
		(*s)->icol_name = 4;

		/*
		 * These need to be done once after the game configuration is
		 * read.
		 */
		(*s)->nprop = 0;
		test_categories[0] = "EQUIPCMP_SCREEN";
		for (i = 0; i < (int)N_ELEMENTS((*s)->propcats); ++i) {
			struct ui_entry_iterator *ui_iter;
			int n, j;

			test_categories[1] = categories[i];
			ui_iter = initialize_ui_entry_iterator(
				check_for_two_categories, test_categories,
				test_categories[1]);
			n = count_ui_entry_iterator(ui_iter);
			(*s)->nprop += n;
			(*s)->propcats[i].n = n;
			(*s)->propcats[i].off = (i == 0) ?
				0 : (*s)->propcats[i - 1].off +
				(*s)->propcats[i - 1].n;
			(*s)->propcats[i].entries = mem_alloc(n *
				sizeof(*(*s)->propcats[i].entries));
			(*s)->propcats[i].labels = mem_alloc(n *
				sizeof(*(*s)->propcats[i].labels));
			(*s)->propcats[i].label_buffer = mem_alloc(n *
				((*s)->nproplab + 1) *
				sizeof(*(*s)->propcats[i].label_buffer));
			for (j = 0; j < n; ++j) {
				struct ui_entry *entry =
					advance_ui_entry_iterator(ui_iter);

				(*s)->propcats[i].entries[j] = entry;
				(*s)->propcats[i].labels[j] =
					(*s)->propcats[i].label_buffer +
					j * ((*s)->nproplab + 1);
				get_ui_entry_label(entry,
					(*s)->nproplab + 1, true,
					(*s)->propcats[i].labels[j]);
			}
			release_ui_entry_iterator(ui_iter);
		}

		/*
		 * Start with nothing for the easy filter but set up space
		 * so it is trivial to add one term filtering on an attribute
		 * and up to three others that can filter on the source of the
		 * item.
		 */
		(*s)->easy_filt.nalloc = 5;
		(*s)->easy_filt.v = mem_alloc((*s)->easy_filt.nalloc *
			sizeof(*(*s)->easy_filt.v));
		switch ((*s)->stores) {
		case EQUIPPABLE_NO_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_ONLY_STORE:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 1;
			(*s)->easy_filt.v[0].s.func = sel_only_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			break;

		case EQUIPPABLE_YES_STORE:
			/* There's no filtering to be done. */
			(*s)->easy_filt.simple = EQUIP_EXPR_TERMINATOR;
			(*s)->easy_filt.nv = 0;
			break;

		case EQUIPPABLE_ONLY_CARRIED:
			(*s)->easy_filt.simple = EQUIP_EXPR_AND;
			(*s)->easy_filt.nv = 3;
			(*s)->easy_filt.v[0].s.func = sel_exclude_src;
			(*s)->easy_filt.v[0].s.ex.src = EQUIP_SOURCE_STORE;
			(*s)->easy_filt.v[0].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[1].s.func = sel_exclude_src;
			(*s)->easy_filt.v[1].s.ex.src = EQUIP_SOURCE_HOME;
			(*s)->easy_filt.v[1].c = EQUIP_EXPR_SELECTOR;
			(*s)->easy_filt.v[2].s.func = sel_exclude_src;
			(*s)->easy_filt.v[2].s.ex.src = EQUIP_SOURCE_FLOOR;
			(*s)->easy_filt.v[2].c = EQUIP_EXPR_SELECTOR;
		}

		for (i = (*s)->easy_filt.nv; i < (*s)->easy_filt.nalloc; ++i) {
			(*s)->easy_filt.v[i].c = EQUIP_EXPR_TERMINATOR;
		}

		/* Start with nothing for the specially configured filter. */
		(*s)->config_filt.v = NULL;
		(*s)->config_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_filt.nv = 0;
		(*s)->config_filt.nalloc = 0;
		(*s)->config_mod_filt.v = NULL;
		(*s)->config_mod_filt.simple = EQUIP_EXPR_TERMINATOR;
		(*s)->config_mod_filt.nv = 0;
		(*s)->config_mod_filt.nalloc = 0;
		(*s)->config_filt_is_on = false;

		/*
		 * The default sort is by equipment slot.  Any ties are
		 * resolved first by the location of the object, rough object
		 * quality, and then alphabetical order.
		 */
		(*s)->default_sort.nalloc = 5;
		(*s)->default_sort.v = mem_alloc((*s)->default_sort.nalloc *
			sizeof(*(*s)->default_sort.v));
		(*s)->default_sort.v[0].func = cmp_by_slot;
		(*s)->default_sort.v[0].propind = 0;
		(*s)->default_sort.v[1].func = cmp_by_location;
		(*s)->default_sort.v[1].propind = 0;
		(*s)->default_sort.v[2].func = cmp_by_quality;
		(*s)->default_sort.v[2].propind = 0;
		(*s)->default_sort.v[3].func = cmp_by_short_name;
		(*s)->default_sort.v[3].propind = 0;
		(*s)->default_sort.v[4].func = 0;
		(*s)->default_sort.v[4].propind = 0;
		(*s)->default_sort.nv = 4;

		/* Start with nothing for the specially configured sort. */
		(*s)->config_sort.v = NULL;
		(*s)->config_sort.nv = 0;
		(*s)->config_sort.nalloc = 0;
		(*s)->config_sort_is_on = false;
	}

	/* These need to be redone on a change to the terminal size. */
	if (reconfigure_for_term_if_necessary(false, p, *s)) {
		return 1;
	}

	/*
	 * These need to be redone for any change in the equipped items, pack,
	 * home, or stores.
	 */

	/* Count the available items to include. */
	count = 0;
	visitor.usefunc = count_objects;
	visitor.usefunc_closure = &count;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	/* Allocate storage and add the available items. */
	if (count > (*s)->nalloc) {
		mem_free((*s)->sorted_indices);
		cleanup_summary_items(*s);
		mem_free((*s)->items);
		(*s)->items = mem_zalloc(count * sizeof(*(*s)->items));
		(*s)->sorted_indices =
			mem_alloc((count + 1) * sizeof(*(*s)->sorted_indices));
		(*s)->nalloc = count;
	}
	(*s)->nitems = 0;
	visitor.usefunc = add_obj_to_summary;
	visitor.usefunc_closure = &add_obj_data;
	add_obj_data.p = p;
	add_obj_data.summary = *s;
	add_obj_data.src = EQUIP_SOURCE_WORN;
	visitor.selfunc = select_any;
	visitor.selfunc_closure = NULL;
	apply_visitor_to_equipped(p, &visitor);
	add_obj_data.src = EQUIP_SOURCE_PACK;
	visitor.selfunc = select_nonequipped_wearable;
	visitor.selfunc_closure = p;
	apply_visitor_to_pile(p->gear, &visitor);
	if (cave) {
		add_obj_data.src = EQUIP_SOURCE_FLOOR;
		visitor.selfunc = select_seen_wearable;
		visitor.selfunc_closure = p;
		apply_visitor_to_pile(square_object(cave, p->grid), &visitor);
	}
	add_obj_data.src = EQUIP_SOURCE_HOME;
	visitor.selfunc = select_wearable;
	visitor.selfunc_closure = NULL;
	if (store_home(p)) {
		apply_visitor_to_pile(store_home(p)->stock, &visitor);
	}

	compute_player_and_equipment_values(p, *s);

	/*
	 * Do an initial filtering and sorting of the items so they're ready
	 * for display.
	 */
	filter_items(*s);
	sort_items(*s);

	/* Reset selection state. */
	(*s)->isel0 = -1;
	(*s)->isel1 = -1;
	(*s)->work_sel = -1;

	return 0;
}